

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * getLinkedTargetsContent
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *prop,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   )

{
  bool bVar1;
  bool bVar2;
  cmLinkImplementationLibraries *this;
  cmLocalGenerator *lg;
  ulong uVar3;
  undefined1 local_240 [8];
  string libResult;
  cmListFileBacktrace local_200;
  string local_1f0;
  undefined1 local_1d0 [8];
  cmGeneratorExpressionContext libContext;
  cmLinkImplItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range2;
  cmLinkImplementationLibraries *impl;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  cmGeneratorExpressionContext *context_local;
  string *prop_local;
  cmGeneratorTarget *target_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this = cmGeneratorTarget::GetLinkImplementationLibraries(target,&context->Config,Usage);
  if (this != (cmLinkImplementationLibraries *)0x0) {
    __end2 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(&this->Libraries);
    lib = (cmLinkImplItem *)
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this->Libraries);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                       *)&lib), bVar2) {
      libContext._344_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
           ::operator*(&__end2);
      if ((((reference)libContext._344_8_)->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
        lg = cmGeneratorTarget::GetLocalGenerator(target);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&context->Config);
        bVar2 = context->Quiet;
        bVar1 = context->EvaluateForBuildsystem;
        cmListFileBacktrace::cmListFileBacktrace
                  (&local_200,(cmListFileBacktrace *)(libContext._344_8_ + 0x30));
        std::__cxx11::string::string
                  ((string *)(libResult.field_2._M_local_buf + 8),(string *)&context->Language);
        cmGeneratorExpressionContext::cmGeneratorExpressionContext
                  ((cmGeneratorExpressionContext *)local_1d0,lg,&local_1f0,(bool)(bVar2 & 1),target,
                   target,(bool)(bVar1 & 1),&local_200,(string *)((long)&libResult.field_2 + 8));
        std::__cxx11::string::~string((string *)(libResult.field_2._M_local_buf + 8));
        cmListFileBacktrace::~cmListFileBacktrace(&local_200);
        std::__cxx11::string::~string((string *)&local_1f0);
        cmGeneratorTarget::EvaluateInterfaceProperty
                  ((string *)local_240,*(cmGeneratorTarget **)(libContext._344_8_ + 0x20),prop,
                   (cmGeneratorExpressionContext *)local_1d0,dagChecker,Usage);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            std::__cxx11::string::size();
            std::__cxx11::string::size();
            std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_240);
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_240);
          }
        }
        std::__cxx11::string::~string((string *)local_240);
        cmGeneratorExpressionContext::~cmGeneratorExpressionContext
                  ((cmGeneratorExpressionContext *)local_1d0);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getLinkedTargetsContent(
  cmGeneratorTarget const* target, std::string const& prop,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker)
{
  std::string result;
  if (cmLinkImplementationLibraries const* impl =
        target->GetLinkImplementationLibraries(
          context->Config, cmGeneratorTarget::LinkInterfaceFor::Usage)) {
    for (cmLinkImplItem const& lib : impl->Libraries) {
      if (lib.Target) {
        // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in our
        // caller's property and hand-evaluate it as if it were compiled.
        // Create a context as cmCompiledGeneratorExpression::Evaluate does.
        cmGeneratorExpressionContext libContext(
          target->GetLocalGenerator(), context->Config, context->Quiet, target,
          target, context->EvaluateForBuildsystem, lib.Backtrace,
          context->Language);
        std::string libResult =
          lib.Target->EvaluateInterfaceProperty(prop, &libContext, dagChecker);
        if (!libResult.empty()) {
          if (result.empty()) {
            result = std::move(libResult);
          } else {
            result.reserve(result.size() + 1 + libResult.size());
            result += ";";
            result += libResult;
          }
        }
      }
    }
  }
  return result;
}